

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

Uint32 load_shader(GPU_ShaderEnum shader_type,char *filename)

{
  int iVar1;
  Uint32 UVar2;
  GPU_Renderer *pGVar3;
  long lVar4;
  size_t sVar5;
  char *__dest;
  size_t sVar6;
  char *__s;
  
  pGVar3 = GPU_GetCurrentRenderer();
  lVar4 = SDL_RWFromFile(filename,"rb");
  if (lVar4 == 0) {
    GPU_PushErrorCode("load_shader",GPU_ERROR_FILE_NOT_FOUND,"Shader file \"%s\" not found",filename
                     );
    UVar2 = 0;
  }
  else {
    iVar1 = SDL_RWseek(lVar4,0,2);
    SDL_RWseek(lVar4,0,0);
    if (pGVar3->shader_language == GPU_LANGUAGE_GLSLES) {
      __s = "#version 100\nprecision mediump int;\nprecision mediump float;\n";
    }
    else if (pGVar3->shader_language == GPU_LANGUAGE_GLSL) {
      __s = "#version 110\n";
      if (0x77 < pGVar3->max_shader_version) {
        __s = "#version 120\n";
      }
    }
    else {
      __s = "";
    }
    sVar5 = strlen(__s);
    __dest = (char *)malloc((long)((int)sVar5 + iVar1 + 1));
    strcpy(__dest,__s);
    sVar6 = strlen(__dest);
    SDL_RWread(lVar4,__dest + sVar6,1,(long)iVar1);
    __dest[(int)sVar5 + iVar1] = '\0';
    UVar2 = GPU_CompileShader(shader_type,__dest);
    free(__dest);
    SDL_RWclose(lVar4);
  }
  return UVar2;
}

Assistant:

Uint32 load_shader(GPU_ShaderEnum shader_type, const char* filename)
{
    SDL_RWops* rwops;
    Uint32 shader;
    char* source;
    int header_size, file_size;
    const char* header = "";
    GPU_Renderer* renderer = GPU_GetCurrentRenderer();
    
    // Open file
    rwops = SDL_RWFromFile(filename, "rb");
    if(rwops == NULL)
    {
        GPU_PushErrorCode("load_shader", GPU_ERROR_FILE_NOT_FOUND, "Shader file \"%s\" not found", filename);
        return 0;
    }
    
    // Get file size
    file_size = SDL_RWseek(rwops, 0, SEEK_END);
    SDL_RWseek(rwops, 0, SEEK_SET);
    
    // Get size from header
    if(renderer->shader_language == GPU_LANGUAGE_GLSL)
    {
        if(renderer->max_shader_version >= 120)
            header = "#version 120\n";
        else
            header = "#version 110\n";  // Maybe this is good enough?
    }
    else if(renderer->shader_language == GPU_LANGUAGE_GLSLES)
        header = "#version 100\nprecision mediump int;\nprecision mediump float;\n";
    
    header_size = strlen(header);
    
    // Allocate source buffer
    source = (char*)malloc(sizeof(char)*(header_size + file_size + 1));
    
    // Prepend header
    strcpy(source, header);
    
    // Read in source code
    SDL_RWread(rwops, source + strlen(source), 1, file_size);
    source[header_size + file_size] = '\0';
    
    // Compile the shader
    shader = GPU_CompileShader(shader_type, source);
    
    // Clean up
    free(source);
    SDL_RWclose(rwops);
    
    return shader;
}